

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::SubtractPropagateStatistics::Operation<short,duckdb::TrySubtractOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  short sVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  short sVar5;
  Value local_70;
  
  sVar1 = NumericStats::GetMin<short>(lstats);
  sVar2 = NumericStats::GetMax<short>(rstats);
  sVar3 = (short)((int)sVar1 - (int)sVar2);
  bVar4 = true;
  if ((int)sVar3 == (int)sVar1 - (int)sVar2) {
    sVar1 = NumericStats::GetMax<short>(lstats);
    sVar2 = NumericStats::GetMin<short>(rstats);
    sVar5 = (short)((int)sVar1 - (int)sVar2);
    if ((int)sVar5 == (int)sVar1 - (int)sVar2) {
      Value::Numeric(&local_70,type,(long)sVar3);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,(long)sVar5);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}